

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O1

void trt_pose::parse::paf_score_graph_out_hw
               (float *score_graph,float *paf_i,float *paf_j,int counts_a,int counts_b,
               float *peaks_a,float *peaks_b,int H,int W,int M,int num_integral_samples)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong local_88;
  
  if (0 < counts_a) {
    local_88 = 0;
    do {
      if (0 < counts_b) {
        fVar9 = peaks_a[local_88 * 2] * (float)H;
        fVar10 = peaks_a[local_88 * 2 + 1] * (float)W;
        uVar5 = 0;
        do {
          fVar11 = peaks_b[uVar5 * 2] * (float)H - fVar9;
          fVar12 = peaks_b[uVar5 * 2 + 1] * (float)W - fVar10;
          fVar6 = fVar11 * fVar11 + fVar12 * fVar12;
          if (fVar6 < 0.0) {
            fVar6 = sqrtf(fVar6);
          }
          else {
            fVar6 = SQRT(fVar6);
          }
          if (num_integral_samples < 1) {
            fVar7 = 0.0;
          }
          else {
            iVar1 = 0;
            fVar7 = 0.0;
            do {
              fVar8 = (float)iVar1 / ((float)num_integral_samples + -1.0);
              iVar2 = (int)(fVar8 * fVar11 + fVar9);
              if ((((-1 < iVar2) && (iVar2 < H)) &&
                  (iVar4 = (int)(fVar8 * fVar12 + fVar10), -1 < iVar4)) && (iVar4 < W)) {
                uVar3 = iVar2 * W + iVar4;
                fVar7 = fVar7 + paf_i[uVar3] * (fVar11 / (fVar6 + 1e-05)) +
                                paf_j[uVar3] * (fVar12 / (fVar6 + 1e-05));
              }
              iVar1 = iVar1 + 1;
            } while (num_integral_samples != iVar1);
          }
          score_graph[local_88 * (long)M + uVar5] = fVar7 / (float)num_integral_samples;
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)counts_b);
      }
      local_88 = local_88 + 1;
    } while (local_88 != (uint)counts_a);
  }
  return;
}

Assistant:

void paf_score_graph_out_hw(float *score_graph, // MxM
                            const float *paf_i, // HxW
                            const float *paf_j, // HxW
                            const int counts_a, const int counts_b,
                            const float *peaks_a, // Mx2
                            const float *peaks_b, // Mx2
                            const int H, const int W, const int M,
                            const int num_integral_samples) {
  for (int a = 0; a < counts_a; a++) {
    // compute point A
    float pa_i = peaks_a[a * 2] * H;
    float pa_j = peaks_a[a * 2 + 1] * W;

    for (int b = 0; b < counts_b; b++) {
      // compute point B
      float pb_i = peaks_b[b * 2] * H;
      float pb_j = peaks_b[b * 2 + 1] * W;

      // compute vector A->B
      float pab_i = pb_i - pa_i;
      float pab_j = pb_j - pa_j;

      // compute normalized vector A->B
      float pab_norm = sqrtf(pab_i * pab_i + pab_j * pab_j) + EPS;
      float uab_i = pab_i / pab_norm;
      float uab_j = pab_j / pab_norm;

      float integral = 0.;
      float increment = 1.f / num_integral_samples;

      for (int t = 0; t < num_integral_samples; t++) {
        // compute integral point T
        float progress = (float)t / ((float)num_integral_samples - 1);
        float pt_i = pa_i + progress * pab_i;
        float pt_j = pa_j + progress * pab_j;

        // convert to int
        // note: we do not need to subtract 0.5 when indexing, because
        // round(x - 0.5) = int(x)
        int pt_i_int = (int)pt_i;
        int pt_j_int = (int)pt_j;

        // skip point if out of bounds (will weaken integral)
        if (pt_i_int < 0)
          continue;
        if (pt_i_int >= H)
          continue;
        if (pt_j_int < 0)
          continue;
        if (pt_j_int >= W)
          continue;

        // get vector at integral point from PAF
        float pt_paf_i = paf_i[pt_i_int * W + pt_j_int];
        float pt_paf_j = paf_j[pt_i_int * W + pt_j_int];

        // compute dot product of normalized A->B with PAF vector at integral
        // point
        float dot = pt_paf_i * uab_i + pt_paf_j * uab_j;
        integral += dot;
      }

      integral /= num_integral_samples;
      score_graph[a * M + b] = integral;
    }
  }
}